

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

SwapChainVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator> *this,
          SwapChainDesc *CtorArgs,RenderDeviceVkImpl **CtorArgs_1,DeviceContextVkImpl **CtorArgs_2,
          LinuxNativeWindow *CtorArgs_3)

{
  SwapChainDesc *pSVar1;
  SwapChainVkImpl *local_48;
  SwapChainVkImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  LinuxNativeWindow *CtorArgs_local_3;
  DeviceContextVkImpl **CtorArgs_local_2;
  RenderDeviceVkImpl **CtorArgs_local_1;
  SwapChainDesc *CtorArgs_local;
  MakeNewRCObj<Diligent::SwapChainVkImpl,_Diligent::IMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pSVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (SwapChainVkImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (SwapChainVkImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_48 = (SwapChainVkImpl *)
               RefCountedObject<Diligent::ISwapChainVk>::operator_new
                         ((RefCountedObject<Diligent::ISwapChainVk> *)0x168,(size_t)pSVar1);
    SwapChainVkImpl::SwapChainVkImpl
              (local_48,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,*CtorArgs_2,CtorArgs_3);
  }
  else {
    local_48 = (SwapChainVkImpl *)
               new<Diligent::IMemoryAllocator>
                         (0x168,*(IMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    SwapChainVkImpl::SwapChainVkImpl
              (local_48,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,*CtorArgs_2,CtorArgs_3);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_48,*(IMemoryAllocator **)this);
  }
  return local_48;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }